

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

Scope * __thiscall TypeSpacebase::getMap(TypeSpacebase *this)

{
  bool bVar1;
  Funcdata *this_00;
  Funcdata *fd;
  Scope *res;
  TypeSpacebase *this_local;
  
  fd = (Funcdata *)Database::getGlobalScope(this->glb->symboltab);
  bVar1 = Address::isInvalid(&this->localframe);
  if ((!bVar1) &&
     (this_00 = Scope::queryFunction((Scope *)fd,&this->localframe), this_00 != (Funcdata *)0x0)) {
    fd = (Funcdata *)Funcdata::getScopeLocal(this_00);
  }
  return (Scope *)fd;
}

Assistant:

Scope *TypeSpacebase::getMap(void) const

{
  Scope *res = glb->symboltab->getGlobalScope();
  if (!localframe.isInvalid()) { // If this spacebase is for a localframe
    Funcdata *fd = res->queryFunction(localframe);
    if (fd != (Funcdata *)0)
      res = fd->getScopeLocal();
  }
  return res;
}